

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  element_type *peVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer piVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int32_t iVar8;
  DenseMatrix *this_00;
  int64_t m;
  size_type __n;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  int iVar19;
  undefined1 auVar18 [16];
  string_view w;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Vector local_48;
  value_type_conflict1 local_34;
  undefined1 auVar17 [16];
  
  peVar1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (DenseMatrix *)0x0;
  }
  else {
    this_00 = (DenseMatrix *)__dynamic_cast(peVar1,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
  }
  if (this_00 == (DenseMatrix *)0x0) {
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (DenseMatrix *)0x0;
  }
  else {
    local_50 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
  }
  m = Matrix::size(&this_00->super_Matrix,0);
  Vector::Vector(&local_48,m);
  DenseMatrix::l2NormRow(this_00,&local_48);
  __n = Matrix::size(&this_00->super_Matrix,0);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_34,&local_51);
  auVar7 = _DAT_001478b0;
  auVar6 = _DAT_001478a0;
  auVar5 = _DAT_001471a0;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar9) {
    uVar10 = (long)piVar9 + (-4 - (long)piVar2);
    auVar18._8_4_ = (int)uVar10;
    auVar18._0_8_ = uVar10;
    auVar18._12_4_ = (int)(uVar10 >> 0x20);
    auVar14._0_8_ = uVar10 >> 2;
    auVar14._8_8_ = auVar18._8_8_ >> 2;
    uVar11 = 0;
    auVar14 = auVar14 ^ _DAT_001471a0;
    do {
      iVar16 = (int)uVar11;
      auVar17._8_4_ = iVar16;
      auVar17._0_8_ = uVar11;
      auVar17._12_4_ = (int)(uVar11 >> 0x20);
      auVar18 = (auVar17 | auVar7) ^ auVar5;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar15 && auVar14._0_4_ < auVar18._0_4_ ||
                  iVar15 < auVar18._4_4_) & 1)) {
        piVar2[uVar11] = iVar16;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        piVar2[uVar11 + 1] = iVar16 + 1;
      }
      auVar18 = (auVar17 | auVar6) ^ auVar5;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar15 && (iVar19 != iVar15 || auVar18._0_4_ <= auVar14._0_4_)) {
        piVar2[uVar11 + 2] = iVar16 + 2;
        piVar2[uVar11 + 3] = iVar16 + 3;
      }
      uVar11 = uVar11 + 4;
    } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
  }
  w._M_str = Dictionary::EOS_abi_cxx11_;
  w._M_len = DAT_001584b0;
  iVar8 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,w);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar10 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar4 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    __comp._M_comp.eosid = iVar8;
    __comp._M_comp.norms = &local_48;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      __comp_01._M_comp.eosid = iVar8;
      __comp_01._M_comp.norms = &local_48;
      __comp_01._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar8;
      __comp_00._M_comp.norms = &local_48;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        iVar15 = *__last_00._M_current;
        piVar12 = __last_00._M_current;
        while( true ) {
          iVar16 = piVar12[-1];
          if (iVar16 != iVar8 && iVar15 != iVar8) {
            bVar13 = local_48.data_.mem_[iVar16] <= local_48.data_.mem_[iVar15] &&
                     local_48.data_.mem_[iVar15] != local_48.data_.mem_[iVar16];
          }
          else {
            bVar13 = iVar15 == iVar8 && iVar16 != iVar8;
          }
          if (!bVar13) break;
          *piVar12 = iVar16;
          piVar12 = piVar12 + -1;
        }
        *piVar12 = iVar15;
      }
    }
  }
  piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((piVar9 != piVar2) &&
     (piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     piVar9 = (pointer)((long)piVar9 + ((long)piVar3 - (long)piVar2)), piVar3 != piVar9)) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar9;
  }
  free(local_48.data_.mem_);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}